

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_dispatch.c
# Opt level: O0

mpt_dispatch * mpt_notify_dispatch(mpt_notify *no)

{
  mpt_dispatch *disp;
  mpt_notify *no_local;
  
  no_local = (mpt_notify *)malloc(0x28);
  if (no_local == (mpt_notify *)0x0) {
    no_local = (mpt_notify *)0x0;
  }
  else {
    if ((no->_disp).cmd != (mpt_event_handler_t)0x0) {
      (*(no->_disp).cmd)((no->_disp).arg,(mpt_event *)0x0);
      (no->_disp).cmd = (mpt_event_handler_t)0x0;
    }
    mpt_dispatch_init((mpt_dispatch *)no_local);
    (no->_disp).cmd = dispatchEvent;
    (no->_disp).arg = no_local;
  }
  return (mpt_dispatch *)no_local;
}

Assistant:

extern MPT_STRUCT(dispatch) *mpt_notify_dispatch(MPT_STRUCT(notify) *no)
{
	MPT_STRUCT(dispatch) *disp;
	
	if (!(disp = malloc(sizeof(*disp)))) {
		return 0;
	}
	if (no->_disp.cmd) {
		no->_disp.cmd(no->_disp.arg, 0);
		no->_disp.cmd = 0;
	}
	mpt_dispatch_init(disp);
	no->_disp.cmd = dispatchEvent;
	no->_disp.arg = disp;
	
	return disp;
}